

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O0

int yaml_parser_scan_version_directive_value
              (yaml_parser_t *parser,yaml_mark_t start_mark,int *major,int *minor)

{
  int iVar1;
  bool bVar2;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int *minor_local;
  int *major_local;
  yaml_parser_t *parser_local;
  
  if (parser->unread != 0) goto LAB_0011d913;
  iVar1 = yaml_parser_update_buffer(parser,1);
  do {
    if (iVar1 == 0) {
      return 0;
    }
LAB_0011d913:
    do {
      bVar2 = true;
      if (*(parser->buffer).pointer != ' ') {
        bVar2 = *(parser->buffer).pointer == '\t';
      }
      if (!bVar2) {
        iVar1 = yaml_parser_scan_version_directive_number(parser,start_mark,major);
        if (iVar1 == 0) {
          return 0;
        }
        if (*(parser->buffer).pointer != '.') {
          iVar1 = yaml_parser_set_scanner_error
                            (parser,"while scanning a %YAML directive",start_mark,
                             "did not find expected digit or \'.\' character");
          return iVar1;
        }
        (parser->mark).index = (parser->mark).index + 1;
        (parser->mark).column = (parser->mark).column + 1;
        parser->unread = parser->unread - 1;
        if ((*(parser->buffer).pointer & 0x80) == 0) {
          local_44 = 1;
        }
        else {
          if ((*(parser->buffer).pointer & 0xe0) == 0xc0) {
            local_48 = 2;
          }
          else {
            if ((*(parser->buffer).pointer & 0xf0) == 0xe0) {
              local_4c = 3;
            }
            else {
              local_4c = 0;
              if ((*(parser->buffer).pointer & 0xf8) == 0xf0) {
                local_4c = 4;
              }
            }
            local_48 = local_4c;
          }
          local_44 = local_48;
        }
        (parser->buffer).pointer = (parser->buffer).pointer + local_44;
        iVar1 = yaml_parser_scan_version_directive_number(parser,start_mark,minor);
        if (iVar1 == 0) {
          return 0;
        }
        return 1;
      }
      (parser->mark).index = (parser->mark).index + 1;
      (parser->mark).column = (parser->mark).column + 1;
      parser->unread = parser->unread - 1;
      if ((*(parser->buffer).pointer & 0x80) == 0) {
        local_38 = 1;
      }
      else {
        if ((*(parser->buffer).pointer & 0xe0) == 0xc0) {
          local_3c = 2;
        }
        else {
          if ((*(parser->buffer).pointer & 0xf0) == 0xe0) {
            local_40 = 3;
          }
          else {
            local_40 = 0;
            if ((*(parser->buffer).pointer & 0xf8) == 0xf0) {
              local_40 = 4;
            }
          }
          local_3c = local_40;
        }
        local_38 = local_3c;
      }
      (parser->buffer).pointer = (parser->buffer).pointer + local_38;
    } while (parser->unread != 0);
    iVar1 = yaml_parser_update_buffer(parser,1);
  } while( true );
}

Assistant:

static int
yaml_parser_scan_version_directive_value(yaml_parser_t *parser,
        yaml_mark_t start_mark, int *major, int *minor)
{
    /* Eat whitespaces. */

    if (!CACHE(parser, 1)) return 0;

    while (IS_BLANK(parser->buffer)) {
        SKIP(parser);
        if (!CACHE(parser, 1)) return 0;
    }

    /* Consume the major version number. */

    if (!yaml_parser_scan_version_directive_number(parser, start_mark, major))
        return 0;

    /* Eat '.'. */

    if (!CHECK(parser->buffer, '.')) {
        return yaml_parser_set_scanner_error(parser, "while scanning a %YAML directive",
                start_mark, "did not find expected digit or '.' character");
    }

    SKIP(parser);

    /* Consume the minor version number. */

    if (!yaml_parser_scan_version_directive_number(parser, start_mark, minor))
        return 0;

    return 1;
}